

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts::TensorValue_RepeatedLongInts
          (TensorValue_RepeatedLongInts *this,TensorValue_RepeatedLongInts *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__TensorValue_RepeatedLongInts_00434a08;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->values_).current_size_ = 0;
  (this->values_).total_size_ = 0;
  (this->values_).rep_ = (Rep *)0x0;
  new_size = (from->values_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<long>::Reserve(&this->values_,new_size);
    memcpy(((this->values_).rep_)->elements,((from->values_).rep_)->elements,
           (long)(from->values_).current_size_ << 3);
    (this->values_).current_size_ = (from->values_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

TensorValue_RepeatedLongInts::TensorValue_RepeatedLongInts(const TensorValue_RepeatedLongInts& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      values_(from.values_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts)
}